

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

bool __thiscall
ReplaceExtraCompilerCacheKey::operator==
          (ReplaceExtraCompilerCacheKey *this,ReplaceExtraCompilerCacheKey *f)

{
  ReplaceFor RVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  undefined1 uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  
  if (this->hash == 0) {
    RVar1 = this->forShell;
    QVar10.m_data = (this->var).d.ptr;
    QVar10.m_size = (this->var).d.size;
    uVar7 = qHash(QVar10,0);
    QVar11.m_data = (this->in).d.ptr;
    QVar11.m_size = (this->in).d.size;
    uVar8 = qHash(QVar11,0);
    QVar12.m_data = (this->out).d.ptr;
    QVar12.m_size = (this->out).d.size;
    uVar9 = qHash(QVar12,0);
    this->hash = uVar9 ^ uVar8 ^ uVar7 ^ RVar1;
  }
  sVar2 = this->hash;
  if (f->hash == 0) {
    RVar1 = f->forShell;
    QVar13.m_data = (f->var).d.ptr;
    QVar13.m_size = (f->var).d.size;
    uVar7 = qHash(QVar13,0);
    QVar14.m_data = (f->in).d.ptr;
    QVar14.m_size = (f->in).d.size;
    uVar8 = qHash(QVar14,0);
    QVar15.m_data = (f->out).d.ptr;
    QVar15.m_size = (f->out).d.size;
    uVar9 = qHash(QVar15,0);
    f->hash = uVar9 ^ uVar8 ^ uVar7 ^ RVar1;
  }
  if ((sVar2 == f->hash) && (f->forShell == this->forShell)) {
    lVar3 = (f->in).d.size;
    lVar4 = (this->in).d.size;
    if (lVar3 == lVar4) {
      QVar16.m_data = (f->in).d.ptr;
      QVar16.m_size = lVar3;
      QVar20.m_data = (this->in).d.ptr;
      QVar20.m_size = lVar4;
      cVar5 = QtPrivate::equalStrings(QVar16,QVar20);
      if (cVar5 != '\0') {
        lVar3 = (f->out).d.size;
        lVar4 = (this->out).d.size;
        if (lVar3 == lVar4) {
          QVar17.m_data = (f->out).d.ptr;
          QVar17.m_size = lVar3;
          QVar21.m_data = (this->out).d.ptr;
          QVar21.m_size = lVar4;
          cVar5 = QtPrivate::equalStrings(QVar17,QVar21);
          if (cVar5 != '\0') {
            lVar3 = (f->var).d.size;
            lVar4 = (this->var).d.size;
            if (lVar3 == lVar4) {
              QVar18.m_data = (f->var).d.ptr;
              QVar18.m_size = lVar3;
              QVar22.m_data = (this->var).d.ptr;
              QVar22.m_size = lVar4;
              cVar5 = QtPrivate::equalStrings(QVar18,QVar22);
              if (cVar5 != '\0') {
                lVar3 = (f->pwd).d.size;
                lVar4 = (this->pwd).d.size;
                if (lVar3 == lVar4) {
                  QVar19.m_data = (f->pwd).d.ptr;
                  QVar19.m_size = lVar3;
                  QVar23.m_data = (this->pwd).d.ptr;
                  QVar23.m_size = lVar4;
                  uVar6 = QtPrivate::equalStrings(QVar19,QVar23);
                  return (bool)uVar6;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ReplaceExtraCompilerCacheKey::operator==(const ReplaceExtraCompilerCacheKey &f) const
{
    return (hashCode() == f.hashCode() &&
            f.forShell == forShell &&
            f.in == in &&
            f.out == out &&
            f.var == var &&
            f.pwd == pwd);
}